

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O0

void __thiscall yactfr::internal::TsdlParser::TsdlParser(TsdlParser *this,char *begin,char *end)

{
  char *end_local;
  char *begin_local;
  TsdlParser *this_local;
  
  StrScanner::StrScanner(&this->_ss,begin,end);
  std::
  vector<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry,_std::allocator<yactfr::internal::TsdlParser::_tFastPseudoFlIntTypeEntry>_>
  ::vector(&this->_fastPseudoFlIntTypes);
  std::unique_ptr<yactfr::TraceType_const,std::default_delete<yactfr::TraceType_const>>::
  unique_ptr<std::default_delete<yactfr::TraceType_const>,void>
            ((unique_ptr<yactfr::TraceType_const,std::default_delete<yactfr::TraceType_const>> *)
             &this->_traceType);
  boost::optional<yactfr::ByteOrder>::optional(&this->_nativeBo);
  boost::optional<yactfr::internal::PseudoTraceType>::optional(&this->_pseudoTraceType);
  this->_envParsed = false;
  std::
  vector<yactfr::internal::TsdlParser::_tStackFrame,_std::allocator<yactfr::internal::TsdlParser::_tStackFrame>_>
  ::vector(&this->_stack);
  if (begin <= end) {
    _parseMetadata(this);
    return;
  }
  __assert_fail("end >= begin",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-parser.cpp"
                ,0x2f0,
                "yactfr::internal::TsdlParser::TsdlParser(const char *const, const char *const)");
}

Assistant:

TsdlParser::TsdlParser(const char * const begin, const char * const end) :
    _ss {begin, end}
{
    assert(end >= begin);
    this->_parseMetadata();
}